

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktClippingTests.cpp
# Opt level: O2

void __thiscall
vkt::clipping::anon_unknown_0::ClipDistance::initPrograms
          (ClipDistance *this,SourceCollections *programCollection,CaseDefinition caseDef)

{
  ostream *poVar1;
  char *pcVar2;
  ProgramSources *pPVar3;
  int iVar4;
  int iVar5;
  int i;
  int iVar6;
  int iVar7;
  allocator<char> local_251;
  ulong local_250;
  ulong local_248;
  SourceCollections *local_240;
  ClipDistance *local_238;
  string local_230;
  string local_210;
  undefined1 local_1f0 [40];
  string perVertexBlock;
  ostringstream str;
  
  local_250 = caseDef._0_8_;
  perVertexBlock._M_dataplus._M_p = (pointer)&perVertexBlock.field_2;
  perVertexBlock._M_string_length = 0;
  perVertexBlock.field_2._M_local_buf[0] = '\0';
  local_240 = programCollection;
  local_238 = this;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&str);
  poVar1 = std::operator<<((ostream *)&str,"gl_PerVertex {\n");
  std::operator<<(poVar1,"    vec4  gl_Position;\n");
  if (0 < (int)local_250) {
    poVar1 = std::operator<<((ostream *)&str,"    float gl_ClipDistance[");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)local_250);
    std::operator<<(poVar1,"];\n");
  }
  local_248 = local_250 >> 0x20;
  if (0 < (int)(local_250 >> 0x20)) {
    poVar1 = std::operator<<((ostream *)&str,"    float gl_CullDistance[");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)local_248);
    std::operator<<(poVar1,"];\n");
  }
  std::operator<<((ostream *)&str,"}");
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&perVertexBlock,(string *)local_1f0);
  std::__cxx11::string::~string((string *)local_1f0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&str);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&str);
  pcVar2 = glu::getGLSLVersionDeclaration(GLSL_VERSION_450);
  poVar1 = std::operator<<((ostream *)&str,pcVar2);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"layout(location = 0) in  vec4 v_position;\n");
  poVar1 = std::operator<<(poVar1,"layout(location = 0) out vec4 out_color;\n");
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"out ");
  poVar1 = std::operator<<(poVar1,(string *)&perVertexBlock);
  poVar1 = std::operator<<(poVar1,";\n");
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"void main (void)\n");
  poVar1 = std::operator<<(poVar1,"{\n");
  poVar1 = std::operator<<(poVar1,"    gl_Position = v_position;\n");
  poVar1 = std::operator<<(poVar1,
                           "    out_color   = vec4(1.0, 0.5 * (v_position.x + 1.0), 0.0, 1.0);\n");
  poVar1 = std::operator<<(poVar1,"\n");
  std::operator<<(poVar1,"    const int barNdx = gl_VertexIndex / 6;\n");
  if (((ulong)local_240 >> 0x20 & 1) == 0) {
    iVar4 = 0;
    iVar5 = 0;
    if (0 < (int)local_250) {
      iVar5 = (int)local_250;
    }
    for (; iVar5 != iVar4; iVar4 = iVar4 + 1) {
      poVar1 = std::operator<<((ostream *)&str,"    gl_ClipDistance[");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar4);
      poVar1 = std::operator<<(poVar1,"] = (barNdx == ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar4);
      std::operator<<(poVar1," ? v_position.y : 0.0);\n");
    }
    iVar4 = 0;
    iVar5 = 0;
    if (0 < (int)local_248) {
      iVar5 = (int)local_248;
    }
    for (; iVar5 != iVar4; iVar4 = iVar4 + 1) {
      poVar1 = std::operator<<((ostream *)&str,"    gl_CullDistance[");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar4);
      std::operator<<(poVar1,"] = 0.0;\n");
    }
  }
  else {
    if (0 < (int)local_250) {
      poVar1 = std::operator<<((ostream *)&str,"    for (int i = 0; i < ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)local_250);
      poVar1 = std::operator<<(poVar1,"; ++i)\n");
      std::operator<<(poVar1,"        gl_ClipDistance[i] = (barNdx == i ? v_position.y : 0.0);\n");
    }
    if (0 < (int)local_248) {
      poVar1 = std::operator<<((ostream *)&str,"    for (int i = 0; i < ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)local_248);
      poVar1 = std::operator<<(poVar1,"; ++i)\n");
      std::operator<<(poVar1,"        gl_CullDistance[i] = 0.0;\n");
    }
  }
  std::operator<<((ostream *)&str,"}\n");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_210,"vert",&local_251);
  pPVar3 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     ((ProgramCollection<glu::ProgramSources> *)local_238,&local_210);
  std::__cxx11::stringbuf::str();
  glu::VertexSource::VertexSource((VertexSource *)local_1f0,&local_230);
  glu::ProgramSources::operator<<(pPVar3,(ShaderSource *)local_1f0);
  std::__cxx11::string::~string((string *)(local_1f0 + 8));
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&str);
  if (((ulong)local_240 >> 0x28 & 1) != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&str);
    pcVar2 = glu::getGLSLVersionDeclaration(GLSL_VERSION_450);
    poVar1 = std::operator<<((ostream *)&str,pcVar2);
    poVar1 = std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<(poVar1,"layout(vertices = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,3);
    poVar1 = std::operator<<(poVar1,") out;\n");
    poVar1 = std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<(poVar1,"layout(location = 0) in  vec4 in_color[];\n");
    poVar1 = std::operator<<(poVar1,"layout(location = 0) out vec4 out_color[];\n");
    poVar1 = std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<(poVar1,"in ");
    poVar1 = std::operator<<(poVar1,(string *)&perVertexBlock);
    poVar1 = std::operator<<(poVar1," gl_in[gl_MaxPatchVertices];\n");
    poVar1 = std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<(poVar1,"out ");
    poVar1 = std::operator<<(poVar1,(string *)&perVertexBlock);
    poVar1 = std::operator<<(poVar1," gl_out[];\n");
    poVar1 = std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<(poVar1,"void main (void)\n");
    poVar1 = std::operator<<(poVar1,"{\n");
    poVar1 = std::operator<<(poVar1,"    gl_TessLevelInner[0] = 1.0;\n");
    poVar1 = std::operator<<(poVar1,"    gl_TessLevelInner[1] = 1.0;\n");
    poVar1 = std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<(poVar1,"    gl_TessLevelOuter[0] = 1.0;\n");
    poVar1 = std::operator<<(poVar1,"    gl_TessLevelOuter[1] = 1.0;\n");
    poVar1 = std::operator<<(poVar1,"    gl_TessLevelOuter[2] = 1.0;\n");
    poVar1 = std::operator<<(poVar1,"    gl_TessLevelOuter[3] = 1.0;\n");
    poVar1 = std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<(poVar1,
                             "    gl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n"
                            );
    poVar1 = std::operator<<(poVar1,
                             "    out_color[gl_InvocationID]          = in_color[gl_InvocationID];\n"
                            );
    std::operator<<(poVar1,"\n");
    if (((ulong)local_240 >> 0x20 & 1) == 0) {
      iVar4 = 0;
      iVar5 = 0;
      if (0 < (int)local_250) {
        iVar5 = (int)local_250;
      }
      for (; iVar5 != iVar4; iVar4 = iVar4 + 1) {
        poVar1 = std::operator<<((ostream *)&str,"    gl_out[gl_InvocationID].gl_ClipDistance[");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar4);
        poVar1 = std::operator<<(poVar1,"] = gl_in[gl_InvocationID].gl_ClipDistance[");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar4);
        std::operator<<(poVar1,"];\n");
      }
      iVar4 = 0;
      iVar5 = 0;
      if (0 < (int)local_248) {
        iVar5 = (int)local_248;
      }
      for (; iVar5 != iVar4; iVar4 = iVar4 + 1) {
        poVar1 = std::operator<<((ostream *)&str,"    gl_out[gl_InvocationID].gl_CullDistance[");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar4);
        poVar1 = std::operator<<(poVar1,"] = gl_in[gl_InvocationID].gl_CullDistance[");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar4);
        std::operator<<(poVar1,"];\n");
      }
    }
    else {
      if (0 < (int)local_250) {
        poVar1 = std::operator<<((ostream *)&str,"    for (int i = 0; i < ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)local_250);
        poVar1 = std::operator<<(poVar1,"; ++i)\n");
        std::operator<<(poVar1,
                        "        gl_out[gl_InvocationID].gl_ClipDistance[i] = gl_in[gl_InvocationID].gl_ClipDistance[i];\n"
                       );
      }
      if (0 < (int)local_248) {
        poVar1 = std::operator<<((ostream *)&str,"    for (int i = 0; i < ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)local_248);
        poVar1 = std::operator<<(poVar1,"; ++i)\n");
        std::operator<<(poVar1,
                        "        gl_out[gl_InvocationID].gl_CullDistance[i] = gl_in[gl_InvocationID].gl_CullDistance[i];\n"
                       );
      }
    }
    std::operator<<((ostream *)&str,"}\n");
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_210,"tesc",&local_251);
    pPVar3 = ::vk::ProgramCollection<glu::ProgramSources>::add
                       ((ProgramCollection<glu::ProgramSources> *)local_238,&local_210);
    std::__cxx11::stringbuf::str();
    glu::TessellationControlSource::TessellationControlSource
              ((TessellationControlSource *)local_1f0,&local_230);
    glu::ProgramSources::operator<<(pPVar3,(ShaderSource *)local_1f0);
    std::__cxx11::string::~string((string *)(local_1f0 + 8));
    std::__cxx11::string::~string((string *)&local_230);
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&str);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&str);
    pcVar2 = glu::getGLSLVersionDeclaration(GLSL_VERSION_450);
    poVar1 = std::operator<<((ostream *)&str,pcVar2);
    poVar1 = std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<(poVar1,"layout(triangles, equal_spacing, ccw) in;\n");
    poVar1 = std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<(poVar1,"layout(location = 0) in  vec4 in_color[];\n");
    poVar1 = std::operator<<(poVar1,"layout(location = 0) out vec4 out_color;\n");
    poVar1 = std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<(poVar1,"in ");
    poVar1 = std::operator<<(poVar1,(string *)&perVertexBlock);
    poVar1 = std::operator<<(poVar1," gl_in[gl_MaxPatchVertices];\n");
    poVar1 = std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<(poVar1,"out ");
    poVar1 = std::operator<<(poVar1,(string *)&perVertexBlock);
    poVar1 = std::operator<<(poVar1,";\n");
    poVar1 = std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<(poVar1,"void main (void)\n");
    poVar1 = std::operator<<(poVar1,"{\n");
    poVar1 = std::operator<<(poVar1,"    vec3 px     = gl_TessCoord.x * gl_in[0].gl_Position.xyz;\n"
                            );
    poVar1 = std::operator<<(poVar1,"    vec3 py     = gl_TessCoord.y * gl_in[1].gl_Position.xyz;\n"
                            );
    poVar1 = std::operator<<(poVar1,"    vec3 pz     = gl_TessCoord.z * gl_in[2].gl_Position.xyz;\n"
                            );
    poVar1 = std::operator<<(poVar1,"    gl_Position = vec4(px + py + pz, 1.0);\n");
    poVar1 = std::operator<<(poVar1,
                             "    out_color   = (in_color[0] + in_color[1] + in_color[2]) / 3.0;\n")
    ;
    std::operator<<(poVar1,"\n");
    if (((ulong)local_240 >> 0x20 & 1) == 0) {
      iVar4 = 0;
      iVar5 = 0;
      if (0 < (int)local_250) {
        iVar5 = (int)local_250;
      }
      for (; iVar5 != iVar4; iVar4 = iVar4 + 1) {
        poVar1 = std::operator<<((ostream *)&str,"    gl_ClipDistance[");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar4);
        poVar1 = std::operator<<(poVar1,"] = gl_TessCoord.x * gl_in[0].gl_ClipDistance[");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar4);
        poVar1 = std::operator<<(poVar1,"]\n");
        poVar1 = std::operator<<(poVar1,
                                 "                       + gl_TessCoord.y * gl_in[1].gl_ClipDistance["
                                );
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar4);
        poVar1 = std::operator<<(poVar1,"]\n");
        poVar1 = std::operator<<(poVar1,
                                 "                       + gl_TessCoord.z * gl_in[2].gl_ClipDistance["
                                );
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar4);
        std::operator<<(poVar1,"];\n");
      }
      iVar4 = 0;
      iVar5 = 0;
      if (0 < (int)local_248) {
        iVar5 = (int)local_248;
      }
      for (; iVar5 != iVar4; iVar4 = iVar4 + 1) {
        poVar1 = std::operator<<((ostream *)&str,"    gl_CullDistance[");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar4);
        poVar1 = std::operator<<(poVar1,"] = gl_TessCoord.x * gl_in[0].gl_CullDistance[");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar4);
        poVar1 = std::operator<<(poVar1,"]\n");
        poVar1 = std::operator<<(poVar1,
                                 "                       + gl_TessCoord.y * gl_in[1].gl_CullDistance["
                                );
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar4);
        poVar1 = std::operator<<(poVar1,"]\n");
        poVar1 = std::operator<<(poVar1,
                                 "                       + gl_TessCoord.z * gl_in[2].gl_CullDistance["
                                );
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar4);
        std::operator<<(poVar1,"];\n");
      }
    }
    else {
      if (0 < (int)local_250) {
        poVar1 = std::operator<<((ostream *)&str,"    for (int i = 0; i < ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)local_250);
        poVar1 = std::operator<<(poVar1,"; ++i)\n");
        poVar1 = std::operator<<(poVar1,
                                 "        gl_ClipDistance[i] = gl_TessCoord.x * gl_in[0].gl_ClipDistance[i]\n"
                                );
        poVar1 = std::operator<<(poVar1,
                                 "                           + gl_TessCoord.y * gl_in[1].gl_ClipDistance[i]\n"
                                );
        std::operator<<(poVar1,
                        "                           + gl_TessCoord.z * gl_in[2].gl_ClipDistance[i];\n"
                       );
      }
      if (0 < (int)local_248) {
        poVar1 = std::operator<<((ostream *)&str,"    for (int i = 0; i < ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)local_248);
        poVar1 = std::operator<<(poVar1,"; ++i)\n");
        poVar1 = std::operator<<(poVar1,
                                 "        gl_CullDistance[i] = gl_TessCoord.x * gl_in[0].gl_CullDistance[i]\n"
                                );
        poVar1 = std::operator<<(poVar1,
                                 "                           + gl_TessCoord.y * gl_in[1].gl_CullDistance[i]\n"
                                );
        std::operator<<(poVar1,
                        "                           + gl_TessCoord.z * gl_in[2].gl_CullDistance[i];\n"
                       );
      }
    }
    std::operator<<((ostream *)&str,"}\n");
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_210,"tese",&local_251);
    pPVar3 = ::vk::ProgramCollection<glu::ProgramSources>::add
                       ((ProgramCollection<glu::ProgramSources> *)local_238,&local_210);
    std::__cxx11::stringbuf::str();
    glu::TessellationEvaluationSource::TessellationEvaluationSource
              ((TessellationEvaluationSource *)local_1f0,&local_230);
    glu::ProgramSources::operator<<(pPVar3,(ShaderSource *)local_1f0);
    std::__cxx11::string::~string((string *)(local_1f0 + 8));
    std::__cxx11::string::~string((string *)&local_230);
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&str);
  }
  if (((ulong)local_240 >> 0x30 & 1) != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&str);
    pcVar2 = glu::getGLSLVersionDeclaration(GLSL_VERSION_450);
    poVar1 = std::operator<<((ostream *)&str,pcVar2);
    poVar1 = std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<(poVar1,"layout(triangles) in;\n");
    poVar1 = std::operator<<(poVar1,"layout(triangle_strip, max_vertices = 3) out;\n");
    poVar1 = std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<(poVar1,"layout(location = 0) in  vec4 in_color[];\n");
    poVar1 = std::operator<<(poVar1,"layout(location = 0) out vec4 out_color;\n");
    poVar1 = std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<(poVar1,"in ");
    poVar1 = std::operator<<(poVar1,(string *)&perVertexBlock);
    poVar1 = std::operator<<(poVar1," gl_in[];\n");
    poVar1 = std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<(poVar1,"out ");
    poVar1 = std::operator<<(poVar1,(string *)&perVertexBlock);
    poVar1 = std::operator<<(poVar1,";\n");
    poVar1 = std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<(poVar1,"void main (void)\n");
    std::operator<<(poVar1,"{\n");
    iVar4 = 0;
    iVar5 = 0;
    if (0 < (int)local_250) {
      iVar5 = (int)local_250;
    }
    iVar7 = 0;
    if (0 < (int)local_248) {
      iVar7 = (int)local_248;
    }
    do {
      if (iVar4 != 0) {
        if (iVar4 == 3) goto LAB_004557fe;
        std::operator<<((ostream *)&str,"\n");
      }
      poVar1 = std::operator<<((ostream *)&str,"    gl_Position = gl_in[");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar4);
      poVar1 = std::operator<<(poVar1,"].gl_Position;\n");
      poVar1 = std::operator<<(poVar1,"    out_color   = in_color[");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar4);
      std::operator<<(poVar1,"];\n");
      if (((ulong)local_240 >> 0x20 & 1) == 0) {
        for (iVar6 = 0; iVar5 != iVar6; iVar6 = iVar6 + 1) {
          poVar1 = std::operator<<((ostream *)&str,"    gl_ClipDistance[");
          poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar6);
          poVar1 = std::operator<<(poVar1,"] = gl_in[");
          poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar4);
          poVar1 = std::operator<<(poVar1,"].gl_ClipDistance[");
          poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar6);
          std::operator<<(poVar1,"];\n");
        }
        for (iVar6 = 0; iVar7 != iVar6; iVar6 = iVar6 + 1) {
          poVar1 = std::operator<<((ostream *)&str,"    gl_CullDistance[");
          poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar6);
          poVar1 = std::operator<<(poVar1,"] = gl_in[");
          poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar4);
          poVar1 = std::operator<<(poVar1,"].gl_CullDistance[");
          poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar6);
          std::operator<<(poVar1,"];\n");
        }
      }
      else {
        if (0 < (int)local_250) {
          poVar1 = std::operator<<((ostream *)&str,"    for (int i = 0; i < ");
          poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)local_250);
          poVar1 = std::operator<<(poVar1,"; ++i)\n");
          poVar1 = std::operator<<(poVar1,"        gl_ClipDistance[i] = gl_in[");
          poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar4);
          std::operator<<(poVar1,"].gl_ClipDistance[i];\n");
        }
        if (0 < (int)local_248) {
          poVar1 = std::operator<<((ostream *)&str,"    for (int i = 0; i < ");
          poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)local_248);
          poVar1 = std::operator<<(poVar1,"; ++i)\n");
          poVar1 = std::operator<<(poVar1,"        gl_CullDistance[i] = gl_in[");
          poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar4);
          std::operator<<(poVar1,"].gl_CullDistance[i];\n");
        }
      }
      std::operator<<((ostream *)&str,"    EmitVertex();\n");
      iVar4 = iVar4 + 1;
    } while( true );
  }
LAB_00455893:
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&str);
  pcVar2 = glu::getGLSLVersionDeclaration(GLSL_VERSION_450);
  poVar1 = std::operator<<((ostream *)&str,pcVar2);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"layout(location = 0) in flat vec4 in_color;\n");
  poVar1 = std::operator<<(poVar1,"layout(location = 0) out vec4 o_color;\n");
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"void main (void)\n");
  poVar1 = std::operator<<(poVar1,"{\n");
  poVar1 = std::operator<<(poVar1,"    o_color = vec4(in_color.rgb + vec3(0.0, 0.0, 0.5), 1.0);\n");
  std::operator<<(poVar1,"}\n");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_210,"frag",&local_251);
  pPVar3 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     ((ProgramCollection<glu::ProgramSources> *)local_238,&local_210);
  std::__cxx11::stringbuf::str();
  glu::FragmentSource::FragmentSource((FragmentSource *)local_1f0,&local_230);
  glu::ProgramSources::operator<<(pPVar3,(ShaderSource *)local_1f0);
  std::__cxx11::string::~string((string *)(local_1f0 + 8));
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&str);
  std::__cxx11::string::~string((string *)&perVertexBlock);
  return;
LAB_004557fe:
  std::operator<<((ostream *)&str,"}\n");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_210,"geom",&local_251);
  pPVar3 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     ((ProgramCollection<glu::ProgramSources> *)local_238,&local_210);
  std::__cxx11::stringbuf::str();
  glu::GeometrySource::GeometrySource((GeometrySource *)local_1f0,&local_230);
  glu::ProgramSources::operator<<(pPVar3,(ShaderSource *)local_1f0);
  std::__cxx11::string::~string((string *)(local_1f0 + 8));
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&str);
  goto LAB_00455893;
}

Assistant:

void initPrograms (SourceCollections& programCollection, const CaseDefinition caseDef)
{
	DE_ASSERT(caseDef.numClipDistances + caseDef.numCullDistances <= MAX_COMBINED_CLIP_AND_CULL_DISTANCES);

	std::string perVertexBlock;
	{
		std::ostringstream str;
		str << "gl_PerVertex {\n"
			<< "    vec4  gl_Position;\n";
		if (caseDef.numClipDistances > 0)
			str << "    float gl_ClipDistance[" << caseDef.numClipDistances << "];\n";
		if (caseDef.numCullDistances > 0)
			str << "    float gl_CullDistance[" << caseDef.numCullDistances << "];\n";
		str << "}";
		perVertexBlock = str.str();
	}

	// Vertex shader
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_450) << "\n"
			<< "\n"
			<< "layout(location = 0) in  vec4 v_position;\n"
			<< "layout(location = 0) out vec4 out_color;\n"
			<< "\n"
			<< "out " << perVertexBlock << ";\n"
			<< "\n"
			<< "void main (void)\n"
			<< "{\n"
			<< "    gl_Position = v_position;\n"
			<< "    out_color   = vec4(1.0, 0.5 * (v_position.x + 1.0), 0.0, 1.0);\n"
			<< "\n"
			<< "    const int barNdx = gl_VertexIndex / 6;\n";
		if (caseDef.dynamicIndexing)
		{
			if (caseDef.numClipDistances > 0)
				src << "    for (int i = 0; i < " << caseDef.numClipDistances << "; ++i)\n"
					<< "        gl_ClipDistance[i] = (barNdx == i ? v_position.y : 0.0);\n";
			if (caseDef.numCullDistances > 0)
				src << "    for (int i = 0; i < " << caseDef.numCullDistances << "; ++i)\n"
					<< "        gl_CullDistance[i] = 0.0;\n";
		}
		else
		{
			for (int i = 0; i < caseDef.numClipDistances; ++i)
				src << "    gl_ClipDistance[" << i << "] = (barNdx == " << i << " ? v_position.y : 0.0);\n";
			for (int i = 0; i < caseDef.numCullDistances; ++i)
				src << "    gl_CullDistance[" << i << "] = 0.0;\n";		// don't cull anything
		}
		src	<< "}\n";

		programCollection.glslSources.add("vert") << glu::VertexSource(src.str());
	}

	if (caseDef.enableTessellation)
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_450) << "\n"
			<< "\n"
			<< "layout(vertices = " << NUM_PATCH_CONTROL_POINTS << ") out;\n"
			<< "\n"
			<< "layout(location = 0) in  vec4 in_color[];\n"
			<< "layout(location = 0) out vec4 out_color[];\n"
			<< "\n"
			<< "in " << perVertexBlock << " gl_in[gl_MaxPatchVertices];\n"
			<< "\n"
			<< "out " << perVertexBlock << " gl_out[];\n"
			<< "\n"
			<< "void main (void)\n"
			<< "{\n"
			<< "    gl_TessLevelInner[0] = 1.0;\n"
			<< "    gl_TessLevelInner[1] = 1.0;\n"
			<< "\n"
			<< "    gl_TessLevelOuter[0] = 1.0;\n"
			<< "    gl_TessLevelOuter[1] = 1.0;\n"
			<< "    gl_TessLevelOuter[2] = 1.0;\n"
			<< "    gl_TessLevelOuter[3] = 1.0;\n"
			<< "\n"
			<< "    gl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n"
			<< "    out_color[gl_InvocationID]          = in_color[gl_InvocationID];\n"
			<< "\n";
		if (caseDef.dynamicIndexing)
		{
			if (caseDef.numClipDistances > 0)
				src << "    for (int i = 0; i < " << caseDef.numClipDistances << "; ++i)\n"
					<< "        gl_out[gl_InvocationID].gl_ClipDistance[i] = gl_in[gl_InvocationID].gl_ClipDistance[i];\n";
			if (caseDef.numCullDistances > 0)
				src << "    for (int i = 0; i < " << caseDef.numCullDistances << "; ++i)\n"
					<< "        gl_out[gl_InvocationID].gl_CullDistance[i] = gl_in[gl_InvocationID].gl_CullDistance[i];\n";
		}
		else
		{
			for (int i = 0; i < caseDef.numClipDistances; ++i)
				src << "    gl_out[gl_InvocationID].gl_ClipDistance[" << i << "] = gl_in[gl_InvocationID].gl_ClipDistance[" << i << "];\n";
			for (int i = 0; i < caseDef.numCullDistances; ++i)
				src << "    gl_out[gl_InvocationID].gl_CullDistance[" << i << "] = gl_in[gl_InvocationID].gl_CullDistance[" << i << "];\n";
		}
		src << "}\n";

		programCollection.glslSources.add("tesc") << glu::TessellationControlSource(src.str());
	}

	if (caseDef.enableTessellation)
	{
		DE_ASSERT(NUM_PATCH_CONTROL_POINTS == 3);  // assumed in shader code

		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_450) << "\n"
			<< "\n"
			<< "layout(triangles, equal_spacing, ccw) in;\n"
			<< "\n"
			<< "layout(location = 0) in  vec4 in_color[];\n"
			<< "layout(location = 0) out vec4 out_color;\n"
			<< "\n"
			<< "in " << perVertexBlock << " gl_in[gl_MaxPatchVertices];\n"
			<< "\n"
			<< "out " << perVertexBlock << ";\n"
			<< "\n"
			<< "void main (void)\n"
			<< "{\n"
			<< "    vec3 px     = gl_TessCoord.x * gl_in[0].gl_Position.xyz;\n"
			<< "    vec3 py     = gl_TessCoord.y * gl_in[1].gl_Position.xyz;\n"
			<< "    vec3 pz     = gl_TessCoord.z * gl_in[2].gl_Position.xyz;\n"
			<< "    gl_Position = vec4(px + py + pz, 1.0);\n"
			<< "    out_color   = (in_color[0] + in_color[1] + in_color[2]) / 3.0;\n"
			<< "\n";
		if (caseDef.dynamicIndexing)
		{
			if (caseDef.numClipDistances > 0)
				src << "    for (int i = 0; i < " << caseDef.numClipDistances << "; ++i)\n"
					<< "        gl_ClipDistance[i] = gl_TessCoord.x * gl_in[0].gl_ClipDistance[i]\n"
					<< "                           + gl_TessCoord.y * gl_in[1].gl_ClipDistance[i]\n"
					<< "                           + gl_TessCoord.z * gl_in[2].gl_ClipDistance[i];\n";
			if (caseDef.numCullDistances > 0)
				src << "    for (int i = 0; i < " << caseDef.numCullDistances << "; ++i)\n"
					<< "        gl_CullDistance[i] = gl_TessCoord.x * gl_in[0].gl_CullDistance[i]\n"
					<< "                           + gl_TessCoord.y * gl_in[1].gl_CullDistance[i]\n"
					<< "                           + gl_TessCoord.z * gl_in[2].gl_CullDistance[i];\n";
		}
		else
		{
			for (int i = 0; i < caseDef.numClipDistances; ++i)
				src << "    gl_ClipDistance[" << i << "] = gl_TessCoord.x * gl_in[0].gl_ClipDistance[" << i << "]\n"
					<< "                       + gl_TessCoord.y * gl_in[1].gl_ClipDistance[" << i << "]\n"
					<< "                       + gl_TessCoord.z * gl_in[2].gl_ClipDistance[" << i << "];\n";
			for (int i = 0; i < caseDef.numCullDistances; ++i)
				src << "    gl_CullDistance[" << i << "] = gl_TessCoord.x * gl_in[0].gl_CullDistance[" << i << "]\n"
					<< "                       + gl_TessCoord.y * gl_in[1].gl_CullDistance[" << i << "]\n"
					<< "                       + gl_TessCoord.z * gl_in[2].gl_CullDistance[" << i << "];\n";
		}
		src << "}\n";

		programCollection.glslSources.add("tese") << glu::TessellationEvaluationSource(src.str());
	}

	if (caseDef.enableGeometry)
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_450) << "\n"
			<< "\n"
			<< "layout(triangles) in;\n"
			<< "layout(triangle_strip, max_vertices = 3) out;\n"
			<< "\n"
			<< "layout(location = 0) in  vec4 in_color[];\n"
			<< "layout(location = 0) out vec4 out_color;\n"
			<< "\n"
			<< "in " << perVertexBlock << " gl_in[];\n"
			<< "\n"
			<< "out " << perVertexBlock << ";\n"
			<< "\n"
			<< "void main (void)\n"
			<< "{\n";
		for (int vertNdx = 0; vertNdx < 3; ++vertNdx)
		{
			if (vertNdx > 0)
				src << "\n";
			src << "    gl_Position = gl_in[" << vertNdx << "].gl_Position;\n"
				<< "    out_color   = in_color[" << vertNdx << "];\n";
			if (caseDef.dynamicIndexing)
			{
				if (caseDef.numClipDistances > 0)
					src << "    for (int i = 0; i < " << caseDef.numClipDistances << "; ++i)\n"
						<< "        gl_ClipDistance[i] = gl_in[" << vertNdx << "].gl_ClipDistance[i];\n";
				if (caseDef.numCullDistances > 0)
					src << "    for (int i = 0; i < " << caseDef.numCullDistances << "; ++i)\n"
						<< "        gl_CullDistance[i] = gl_in[" << vertNdx << "].gl_CullDistance[i];\n";
			}
			else
			{
				for (int i = 0; i < caseDef.numClipDistances; ++i)
					src << "    gl_ClipDistance[" << i << "] = gl_in[" << vertNdx << "].gl_ClipDistance[" << i << "];\n";
				for (int i = 0; i < caseDef.numCullDistances; ++i)
					src << "    gl_CullDistance[" << i << "] = gl_in[" << vertNdx << "].gl_CullDistance[" << i << "];\n";
			}
			src << "    EmitVertex();\n";
		}
		src	<< "}\n";

		programCollection.glslSources.add("geom") << glu::GeometrySource(src.str());
	}

	// Fragment shader
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_450) << "\n"
			<< "\n"
			<< "layout(location = 0) in flat vec4 in_color;\n"
			<< "layout(location = 0) out vec4 o_color;\n"
			<< "\n"
			<< "void main (void)\n"
			<< "{\n"
			<< "    o_color = vec4(in_color.rgb + vec3(0.0, 0.0, 0.5), 1.0);\n"  // mix with a constant color in case variable wasn't passed correctly through stages
			<< "}\n";

		programCollection.glslSources.add("frag") << glu::FragmentSource(src.str());
	}
}